

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O2

void __thiscall pg::NPPSolver::atronsubgamedw(NPPSolver *this)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *pdVar5;
  bitset *pbVar6;
  Game *pGVar7;
  long lVar8;
  uint64_t *puVar9;
  uint64_t *puVar10;
  bitset *pbVar11;
  uint64_t *puVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  _Elt_pointer puVar16;
  uint *puVar17;
  long lVar18;
  uint *puVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  uint local_58;
  uint local_54;
  _Map_pointer local_50;
  _Elt_pointer local_48;
  _Elt_pointer local_40;
  _Elt_pointer local_38;
  
  pdVar5 = (this->Heads).
           super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[this->Top];
  local_40 = ((iterator *)
             ((long)&(pdVar5->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Deque_impl_data + 0x30))->_M_cur;
  local_48 = *(_Elt_pointer *)
              ((long)&(pdVar5->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Deque_impl_data + 0x20);
  puVar16 = ((iterator *)
            ((long)&(pdVar5->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                    .super__Deque_impl_data + 0x10))->_M_cur;
  local_50 = *(_Map_pointer *)
              ((long)&(pdVar5->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Deque_impl_data + 0x28);
  do {
    if (puVar16 == local_40) {
LAB_0014df63:
      iVar20 = (this->T).pointer;
      if ((long)iVar20 == 0) {
        return;
      }
      (this->T).pointer = iVar20 + -1;
      uVar14 = (this->T).queue[(long)iVar20 + -1];
      pbVar6 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
               _M_impl.super__Vector_impl_data._M_start[this->Top];
      pGVar7 = (this->super_Solver).game;
      lVar8 = *(long *)&((this->Entries).
                         super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[this->Top]->
                        super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )._M_impl._M_node;
      puVar17 = (uint *)(pGVar7->_inedges + pGVar7->_firstins[(int)uVar14]);
LAB_0014dca1:
      uVar2 = *puVar17;
      uVar22 = (ulong)(int)uVar2;
      if (uVar22 != 0xffffffffffffffff) {
        uVar24 = uVar22 >> 6;
        if (((this->outgame)._bits[uVar24] >> (uVar22 & 0x3f) & 1) == 0) {
          uVar23 = 1L << (uVar22 & 0x3f);
          if ((pbVar6->_bits[uVar24] & uVar23) == 0) {
            uVar15 = Solver::owner(&this->super_Solver,uVar2);
            puVar9 = (this->R)._bits;
            uVar21 = puVar9[uVar24];
            if (uVar15 == this->alpha) {
              if ((uVar21 & uVar23) == 0) {
                puVar9[uVar24] = uVar21 | uVar23;
                this->strategy[uVar22] = uVar14;
LAB_0014df37:
                iVar20 = (this->T).pointer;
                (this->T).pointer = iVar20 + 1;
                (this->T).queue[iVar20] = uVar2;
              }
              else {
                puVar9 = (this->O)._bits;
                uVar21 = puVar9[uVar24];
                if ((uVar21 & uVar23) != 0) {
                  puVar9[uVar24] = ~uVar23 & uVar21;
                  this->strategy[uVar22] = uVar14;
                }
              }
            }
            else {
              if ((uVar21 & uVar23) == 0) {
                pGVar7 = (this->super_Solver).game;
                pbVar11 = (this->Supgame).
                          super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                          super__Vector_impl_data._M_start[this->Top];
                puVar10 = (this->outgame)._bits;
                puVar19 = (uint *)(pGVar7->_outedges + pGVar7->_firstouts[uVar22]);
                puVar13 = (this->E).queue;
                while( true ) {
                  uVar15 = *puVar19;
                  uVar22 = (ulong)(int)uVar15;
                  if (uVar22 == 0xffffffffffffffff) break;
                  uVar21 = uVar22 >> 6;
                  if ((puVar10[uVar21] >> (uVar22 & 0x3f) & 1) == 0) {
                    uVar22 = 1L << (uVar22 & 0x3f);
                    if ((puVar9[uVar21] & uVar22) == 0) {
                      if ((pbVar11->_bits[uVar21] & uVar22) == 0) goto LAB_0014df57;
                      iVar20 = (this->E).pointer;
                      (this->E).pointer = iVar20 + 1;
                      puVar13[iVar20] = uVar15;
                    }
                  }
                  puVar19 = puVar19 + 1;
                }
                puVar13 = (this->E).queue;
                pbVar11 = (this->Exits).
                          super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                          super__Vector_impl_data._M_start[this->Pivot];
                iVar20 = (this->E).pointer;
                lVar18 = (long)iVar20;
                while( true ) {
                  iVar20 = iVar20 + -1;
                  bVar25 = lVar18 == 0;
                  lVar18 = lVar18 + -1;
                  if (bVar25) break;
                  (this->E).pointer = iVar20;
                  uVar3 = puVar13[lVar18];
                  puVar1 = pbVar11->_bits + (uVar3 >> 6);
                  *puVar1 = *puVar1 | 1L << ((ulong)uVar3 & 0x3f);
                }
                this->strategy[uVar2] = -1;
                puVar9[uVar24] = puVar9[uVar24] | uVar23;
                goto LAB_0014df37;
              }
              puVar10 = (this->O)._bits;
              if ((puVar10[uVar24] & uVar23) != 0) {
                pGVar7 = (this->super_Solver).game;
                pbVar11 = (this->Supgame).
                          super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                          super__Vector_impl_data._M_start[this->Top];
                puVar12 = (this->outgame)._bits;
                puVar19 = (uint *)(pGVar7->_outedges + pGVar7->_firstouts[uVar22]);
                puVar13 = (this->E).queue;
                while( true ) {
                  uVar15 = *puVar19;
                  uVar22 = (ulong)(int)uVar15;
                  if (uVar22 == 0xffffffffffffffff) break;
                  uVar21 = uVar22 >> 6;
                  if ((puVar12[uVar21] >> (uVar22 & 0x3f) & 1) == 0) {
                    uVar22 = 1L << (uVar22 & 0x3f);
                    if ((puVar9[uVar21] & uVar22) == 0) {
                      if ((pbVar11->_bits[uVar21] & uVar22) == 0) goto LAB_0014df57;
                      iVar20 = (this->E).pointer;
                      (this->E).pointer = iVar20 + 1;
                      puVar13[iVar20] = uVar15;
                    }
                  }
                  puVar19 = puVar19 + 1;
                }
                puVar13 = (this->E).queue;
                pbVar11 = (this->Exits).
                          super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                          super__Vector_impl_data._M_start[this->Pivot];
                iVar20 = (this->E).pointer;
                lVar18 = (long)iVar20;
                while( true ) {
                  iVar20 = iVar20 + -1;
                  bVar25 = lVar18 == 0;
                  lVar18 = lVar18 + -1;
                  if (bVar25) break;
                  (this->E).pointer = iVar20;
                  uVar3 = puVar13[lVar18];
                  puVar1 = pbVar11->_bits + (uVar3 >> 6);
                  *puVar1 = *puVar1 | 1L << ((ulong)uVar3 & 0x3f);
                }
                this->strategy[uVar2] = -1;
                puVar1 = puVar10 + uVar24;
                *puVar1 = *puVar1 & ~uVar23;
              }
            }
          }
          else {
            local_58 = uVar2;
            std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar8 + 0x10),
                       &local_58);
          }
        }
        goto LAB_0014dcf1;
      }
      goto LAB_0014df63;
    }
    uVar2 = *puVar16;
    pbVar6 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl
             .super__Vector_impl_data._M_start[this->Top];
    pGVar7 = (this->super_Solver).game;
    lVar8 = *(long *)&((this->Entries).
                       super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[this->Top]->
                      super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )._M_impl._M_node;
    puVar17 = (uint *)(pGVar7->_inedges + pGVar7->_firstins[(int)uVar2]);
    local_38 = puVar16;
LAB_0014d946:
    uVar3 = *puVar17;
    uVar22 = (ulong)(int)uVar3;
    if (uVar22 != 0xffffffffffffffff) {
      uVar24 = uVar22 >> 6;
      if (((this->outgame)._bits[uVar24] >> (uVar22 & 0x3f) & 1) == 0) {
        uVar23 = 1L << (uVar22 & 0x3f);
        if ((pbVar6->_bits[uVar24] & uVar23) == 0) {
          uVar14 = Solver::owner(&this->super_Solver,uVar3);
          puVar9 = (this->R)._bits;
          uVar21 = puVar9[uVar24];
          if (uVar14 == this->alpha) {
            if ((uVar21 & uVar23) == 0) {
              puVar9[uVar24] = uVar21 | uVar23;
              this->strategy[uVar22] = uVar2;
LAB_0014dbe2:
              iVar20 = (this->T).pointer;
              (this->T).pointer = iVar20 + 1;
              (this->T).queue[iVar20] = uVar3;
            }
            else {
              puVar9 = (this->O)._bits;
              uVar21 = puVar9[uVar24];
              if ((uVar21 & uVar23) != 0) {
                puVar9[uVar24] = ~uVar23 & uVar21;
                this->strategy[uVar22] = uVar2;
              }
            }
          }
          else {
            if ((uVar21 & uVar23) == 0) {
              pGVar7 = (this->super_Solver).game;
              pbVar11 = (this->Supgame).
                        super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                        super__Vector_impl_data._M_start[this->Top];
              puVar10 = (this->outgame)._bits;
              puVar19 = (uint *)(pGVar7->_outedges + pGVar7->_firstouts[uVar22]);
              puVar13 = (this->E).queue;
              while( true ) {
                uVar14 = *puVar19;
                uVar22 = (ulong)(int)uVar14;
                if (uVar22 == 0xffffffffffffffff) break;
                uVar21 = uVar22 >> 6;
                if ((puVar10[uVar21] >> (uVar22 & 0x3f) & 1) == 0) {
                  uVar22 = 1L << (uVar22 & 0x3f);
                  if ((puVar9[uVar21] & uVar22) == 0) {
                    if ((pbVar11->_bits[uVar21] & uVar22) == 0) goto LAB_0014dc02;
                    iVar20 = (this->E).pointer;
                    (this->E).pointer = iVar20 + 1;
                    puVar13[iVar20] = uVar14;
                  }
                }
                puVar19 = puVar19 + 1;
              }
              puVar13 = (this->E).queue;
              pbVar11 = (this->Exits).
                        super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                        super__Vector_impl_data._M_start[this->Pivot];
              iVar20 = (this->E).pointer;
              lVar18 = (long)iVar20;
              while( true ) {
                iVar20 = iVar20 + -1;
                bVar25 = lVar18 == 0;
                lVar18 = lVar18 + -1;
                if (bVar25) break;
                (this->E).pointer = iVar20;
                uVar4 = puVar13[lVar18];
                puVar1 = pbVar11->_bits + (uVar4 >> 6);
                *puVar1 = *puVar1 | 1L << ((ulong)uVar4 & 0x3f);
              }
              this->strategy[uVar3] = -1;
              puVar9[uVar24] = puVar9[uVar24] | uVar23;
              goto LAB_0014dbe2;
            }
            puVar10 = (this->O)._bits;
            if ((puVar10[uVar24] & uVar23) != 0) {
              pGVar7 = (this->super_Solver).game;
              pbVar11 = (this->Supgame).
                        super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                        super__Vector_impl_data._M_start[this->Top];
              puVar12 = (this->outgame)._bits;
              puVar19 = (uint *)(pGVar7->_outedges + pGVar7->_firstouts[uVar22]);
              puVar13 = (this->E).queue;
              while( true ) {
                uVar14 = *puVar19;
                uVar22 = (ulong)(int)uVar14;
                if (uVar22 == 0xffffffffffffffff) break;
                uVar21 = uVar22 >> 6;
                if ((puVar12[uVar21] >> (uVar22 & 0x3f) & 1) == 0) {
                  uVar22 = 1L << (uVar22 & 0x3f);
                  if ((puVar9[uVar21] & uVar22) == 0) {
                    if ((pbVar11->_bits[uVar21] & uVar22) == 0) goto LAB_0014dc02;
                    iVar20 = (this->E).pointer;
                    (this->E).pointer = iVar20 + 1;
                    puVar13[iVar20] = uVar14;
                  }
                }
                puVar19 = puVar19 + 1;
              }
              puVar13 = (this->E).queue;
              pbVar11 = (this->Exits).
                        super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                        super__Vector_impl_data._M_start[this->Pivot];
              iVar20 = (this->E).pointer;
              lVar18 = (long)iVar20;
              while( true ) {
                iVar20 = iVar20 + -1;
                bVar25 = lVar18 == 0;
                lVar18 = lVar18 + -1;
                if (bVar25) break;
                (this->E).pointer = iVar20;
                uVar4 = puVar13[lVar18];
                puVar1 = pbVar11->_bits + (uVar4 >> 6);
                *puVar1 = *puVar1 | 1L << ((ulong)uVar4 & 0x3f);
              }
              this->strategy[uVar3] = -1;
              puVar1 = puVar10 + uVar24;
              *puVar1 = *puVar1 & ~uVar23;
            }
          }
        }
        else {
          local_54 = uVar3;
          std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar8 + 0x10),&local_54)
          ;
        }
      }
      goto LAB_0014d993;
    }
    puVar16 = local_38 + 1;
    if (puVar16 == local_48) {
      puVar16 = local_50[1];
      local_50 = local_50 + 1;
      local_48 = puVar16 + 0x80;
    }
  } while( true );
LAB_0014df57:
  (this->E).pointer = 0;
LAB_0014dcf1:
  puVar17 = puVar17 + 1;
  goto LAB_0014dca1;
LAB_0014dc02:
  (this->E).pointer = 0;
LAB_0014d993:
  puVar17 = puVar17 + 1;
  goto LAB_0014d946;
}

Assistant:

void NPPSolver::atronsubgamedw()
{
    auto & heads = *(Heads[Top]);
    auto qend = heads.end();
    for (auto qiter = heads.begin(); qiter != qend; ++qiter)
    {
        pushinqueueonsubgamedw(*qiter);
    }
    while (T.nonempty())
    {
        pushinqueueonsubgamedw(T.pop());
    }
}